

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void el::Loggers::configureFromGlobal(char *globalConfigurationFilePath)

{
  long lVar1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  bool bVar8;
  Logger *logger;
  string line;
  anon_class_16_2_58e2ca49 configure;
  stringstream ss;
  ifstream gcfStream;
  Logger *local_438;
  string local_430;
  undefined1 *local_410;
  long local_408;
  undefined1 local_400 [16];
  undefined1 *local_3f0;
  string *local_3e8;
  undefined1 local_3e0 [16];
  anon_class_16_2_58e2ca49 local_3d0;
  stringstream local_3c0 [16];
  long local_3b0;
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,globalConfigurationFilePath,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__cxx11::stringstream::stringstream(local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b0,"Unable to open global configuration file [",0x2a);
    if (globalConfigurationFilePath == (char *)0x0) {
      std::ios::clear((int)(ostream *)&local_3b0 + (int)*(undefined8 *)(local_3b0 + -0x18));
    }
    else {
      sVar6 = strlen(globalConfigurationFilePath);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,globalConfigurationFilePath,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0,"] for parsing.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xb7f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [gcfStream.is_open()",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_430._M_dataplus._M_p,local_430._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_3c0);
  local_438 = (Logger *)0x0;
  lVar1 = *(long *)(local_238[0] + -0x18);
  local_3d0.ss = (stringstream *)local_3c0;
  local_3d0.logger = &local_438;
  if (*(int *)((long)aiStack_218 + lVar1) == 0) {
    local_3d0.logger = &local_438;
    do {
      cVar3 = std::ios::widen((char)&local_438 + (char)lVar1);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_430,cVar3);
      base::utils::Str::rtrim(&local_430);
      base::utils::Str::ltrim(&local_430);
      bVar4 = Configurations::Parser::isComment(&local_430);
      if (!bVar4) {
        Configurations::Parser::ignoreComments(&local_430);
        base::utils::Str::rtrim(&local_430);
        base::utils::Str::ltrim(&local_430);
        sVar2 = local_430._M_string_length;
        if (local_430._M_string_length < (string *)0x3) {
LAB_0016ade7:
          bVar4 = false;
        }
        else {
          local_3f0 = local_3e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"--","");
          if (local_430._M_string_length < local_3e8) goto LAB_0016ade7;
          iVar5 = std::__cxx11::string::compare((ulong)&local_430,0,local_3e8);
          bVar4 = iVar5 == 0;
        }
        if (((string *)0x2 < sVar2) && (local_3f0 != local_3e0)) {
          operator_delete(local_3f0);
        }
        if (bVar4) {
          std::__cxx11::stringbuf::str();
          bVar4 = local_408 != 0;
          bVar8 = local_438 != (Logger *)0x0;
          if (local_410 != local_400) {
            operator_delete(local_410);
          }
          if (bVar4 && bVar8) {
            configureFromGlobal::anon_class_16_2_58e2ca49::operator()(&local_3d0);
          }
          local_410 = local_400;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
          std::__cxx11::stringbuf::str(local_3a8);
          if (local_410 != local_400) {
            operator_delete(local_410);
          }
          std::__cxx11::string::substr((ulong)&local_410,(ulong)&local_430);
          std::__cxx11::string::operator=((string *)&local_430,(string *)&local_410);
          if (local_410 != local_400) {
            operator_delete(local_410);
          }
          base::utils::Str::rtrim(&local_430);
          base::utils::Str::ltrim(&local_430);
          if ((string *)0x1 < local_430._M_string_length) {
            local_438 = base::RegisteredLoggers::get
                                  (*(RegisteredLoggers **)(base::elStorage + 0x10),&local_430,true);
          }
        }
        else {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_3b0,local_430._M_dataplus._M_p,
                              local_430._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
      }
      lVar1 = *(long *)(local_238[0] + -0x18);
    } while (*(int *)((long)aiStack_218 + lVar1) == 0);
  }
  std::__cxx11::stringbuf::str();
  bVar4 = local_438 != (Logger *)0x0;
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  if (bVar4 && local_408 != 0) {
    configureFromGlobal::anon_class_16_2_58e2ca49::operator()(&local_3d0);
  }
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Loggers::configureFromGlobal(const char* globalConfigurationFilePath) {
  std::ifstream gcfStream(globalConfigurationFilePath, std::ifstream::in);
  ELPP_ASSERT(gcfStream.is_open(), "Unable to open global configuration file [" << globalConfigurationFilePath
              << "] for parsing.");
  std::string line = std::string();
  std::stringstream ss;
  Logger* logger = nullptr;
  auto configure = [&](void) {
    ELPP_INTERNAL_INFO(8, "Configuring logger: '" << logger->id() << "' with configurations \n" << ss.str()
                       << "\n--------------");
    Configurations c;
    c.parseFromText(ss.str());
    logger->configure(c);
  };
  while (gcfStream.good()) {
    std::getline(gcfStream, line);
    ELPP_INTERNAL_INFO(1, "Parsing line: " << line);
    base::utils::Str::trim(line);
    if (Configurations::Parser::isComment(line)) continue;
    Configurations::Parser::ignoreComments(&line);
    base::utils::Str::trim(line);
    if (line.size() > 2 && base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLoggerId))) {
      if (!ss.str().empty() && logger != nullptr) {
        configure();
      }
      ss.str(std::string(""));
      line = line.substr(2);
      base::utils::Str::trim(line);
      if (line.size() > 1) {
        ELPP_INTERNAL_INFO(1, "Getting logger: '" << line << "'");
        logger = getLogger(line);
      }
    } else {
      ss << line << "\n";
    }
  }
  if (!ss.str().empty() && logger != nullptr) {
    configure();
  }
}